

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

void __thiscall
JsUtil::
BaseDictionary<Js::ByteBuffer_*,_Js::IndexEntry,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<Js::ByteBuffer_*,_Js::IndexEntry,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *this)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  ByteBuffer *pBVar1;
  code *pcVar2;
  uint newSize;
  bool bVar3;
  uint uVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  SimpleDictionaryEntry<Js::ByteBuffer_*,_Js::IndexEntry> *dst;
  ulong uVar7;
  Type pSVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  hash_t hVar13;
  long lVar14;
  size_t requestedBytes;
  int *local_48;
  int *newBuckets;
  SimpleDictionaryEntry<Js::ByteBuffer_*,_Js::IndexEntry> *pSStack_38;
  int modIndex;
  EntryType *newEntries;
  
  newSize = this->count * 2;
  newBuckets._4_4_ = 0x4b;
  uVar4 = 4;
  if (8 < newSize) {
    uVar4 = this->count & 0x7fffffff;
  }
  uVar4 = PrimePolicy::GetPrime(uVar4,(int *)((long)&newBuckets + 4));
  local_48 = (Type)0x0;
  pSStack_38 = (SimpleDictionaryEntry<Js::ByteBuffer_*,_Js::IndexEntry> *)0x0;
  if (uVar4 == this->bucketCount) {
    if (newSize == 0) {
      dst = (SimpleDictionaryEntry<Js::ByteBuffer_*,_Js::IndexEntry> *)&DAT_00000008;
    }
    else {
      this_00 = &this->alloc->
                 super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      requestedBytes = 0xffffffffffffffff;
      if (-1 < (int)newSize) {
        requestedBytes = (ulong)newSize << 5;
      }
      BVar5 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar3) goto LAB_008743d4;
        *puVar6 = 0;
      }
      dst = (SimpleDictionaryEntry<Js::ByteBuffer_*,_Js::IndexEntry> *)
            Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
            AllocInternal(this_00,requestedBytes);
      memset(dst,0,requestedBytes);
      memset((char *)((long)&(dst->
                             super_DefaultHashedEntry<Js::ByteBuffer_*,_Js::IndexEntry,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                             ).super_KeyValueEntry<Js::ByteBuffer_*,_Js::IndexEntry>.
                             super_ValueEntry<Js::IndexEntry,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::ByteBuffer_*,_Js::IndexEntry>_>
                             .super_KeyValueEntryDataLayout2<Js::ByteBuffer_*,_Js::IndexEntry>.value
                             .isPropertyRecord + requestedBytes),0,
             (requestedBytes + 0xf & 0xfffffffffffffff0) - requestedBytes);
      if (dst == (SimpleDictionaryEntry<Js::ByteBuffer_*,_Js::IndexEntry> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar3) {
LAB_008743d4:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
        dst = (SimpleDictionaryEntry<Js::ByteBuffer_*,_Js::IndexEntry> *)0x0;
      }
    }
    pSStack_38 = dst;
    Memory::
    CopyArray<JsUtil::SimpleDictionaryEntry<Js::ByteBuffer*,Js::IndexEntry>,Js::IndexEntry,Memory::ArenaAllocator>
              (dst,(long)(int)newSize,this->entries,(long)this->count);
    DeleteEntries(this,this->entries,this->size);
    this->entries = pSStack_38;
    this->size = newSize;
    this->modFunctionIndex = newBuckets._4_4_;
  }
  else {
    Allocate(this,&local_48,&stack0xffffffffffffffc8,uVar4,newSize);
    Memory::
    CopyArray<JsUtil::SimpleDictionaryEntry<Js::ByteBuffer*,Js::IndexEntry>,Js::IndexEntry,Memory::ArenaAllocator>
              (pSStack_38,(long)(int)newSize,this->entries,(long)this->count);
    this->modFunctionIndex = newBuckets._4_4_;
    iVar9 = this->count;
    if (0 < iVar9) {
      lVar14 = 0;
      pSVar8 = pSStack_38;
      do {
        if (-2 < pSVar8[lVar14].
                 super_DefaultHashedEntry<Js::ByteBuffer_*,_Js::IndexEntry,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                 .super_KeyValueEntry<Js::ByteBuffer_*,_Js::IndexEntry>.
                 super_ValueEntry<Js::IndexEntry,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::ByteBuffer_*,_Js::IndexEntry>_>
                 .super_KeyValueEntryDataLayout2<Js::ByteBuffer_*,_Js::IndexEntry>.next) {
          pBVar1 = pSVar8[lVar14].
                   super_DefaultHashedEntry<Js::ByteBuffer_*,_Js::IndexEntry,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                   .super_KeyValueEntry<Js::ByteBuffer_*,_Js::IndexEntry>.
                   super_ValueEntry<Js::IndexEntry,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::ByteBuffer_*,_Js::IndexEntry>_>
                   .super_KeyValueEntryDataLayout2<Js::ByteBuffer_*,_Js::IndexEntry>.key;
          uVar7 = (ulong)pBVar1->byteCount;
          if (uVar7 == 0) {
            hVar13 = 0x11c9dc5;
          }
          else {
            uVar10 = 0x811c9dc5;
            uVar11 = 0;
            do {
              uVar12 = (int)*(char *)((long)(pBVar1->field_1).pv + uVar11) ^ uVar10;
              uVar10 = uVar12 * 0x1000193;
              uVar11 = uVar11 + 1;
            } while (uVar7 != uVar11);
            hVar13 = uVar12 * 0x2000326 >> 1;
          }
          hVar13 = PrimePolicy::ModPrime(hVar13,uVar4,this->modFunctionIndex);
          pSStack_38[lVar14].
          super_DefaultHashedEntry<Js::ByteBuffer_*,_Js::IndexEntry,_JsUtil::(anonymous_namespace)::KeyValueEntry>
          .super_KeyValueEntry<Js::ByteBuffer_*,_Js::IndexEntry>.
          super_ValueEntry<Js::IndexEntry,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::ByteBuffer_*,_Js::IndexEntry>_>
          .super_KeyValueEntryDataLayout2<Js::ByteBuffer_*,_Js::IndexEntry>.next =
               local_48[(int)hVar13];
          local_48[(int)hVar13] = (int)lVar14;
          iVar9 = this->count;
          pSVar8 = pSStack_38;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < iVar9);
    }
    DeleteBuckets(this,this->buckets,this->bucketCount);
    DeleteEntries(this,this->entries,this->size);
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this->stats,newSize,newSize - this->size);
    }
    this->buckets = local_48;
    this->entries = pSStack_38;
    this->bucketCount = uVar4;
    this->size = newSize;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }